

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  cmCommandContext *lfcc;
  string local_38;
  
  lfcc = (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
  cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_38,&this->StateSnapshot);
  cmListFileContext::FromCommandContext(__return_storage_ptr__,lfcc,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  return cmListFileContext::FromCommandContext(
        *this->ContextStack.back(),
        this->StateSnapshot.GetExecutionListFile());
}